

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_sub_CC(TCGContext_conflict1 *tcg_ctx,int sf,TCGv_i64 dest,TCGv_i64 t0,TCGv_i64 t1)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i32 ret_02;
  TCGv_i32 ret_03;
  TCGv_i32 ret_04;
  uintptr_t o_5;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  if (sf != 0) {
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_sub_i64(tcg_ctx,ret,t0,t1);
    gen_set_NZ64(tcg_ctx,ret);
    tcg_gen_setcond_i64_aarch64(tcg_ctx,TCG_COND_GEU,ret_00,t0,t1);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,ret_00);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ret_00,ret,t0);
    ret_01 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ret_01,t0,t1);
    tcg_gen_and_i64_aarch64(tcg_ctx,ret_00,ret_00,ret_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    tcg_gen_extrh_i64_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,ret_00);
    tcg_gen_mov_i64_aarch64(tcg_ctx,dest,ret);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  ret_02 = tcg_temp_new_i32(tcg_ctx);
  ret_03 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret_02,t0);
  tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret_03,t1);
  tcg_gen_sub_i32(tcg_ctx,tcg_ctx->cpu_NF,ret_02,ret_03);
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_ZF,tcg_ctx->cpu_NF);
  tcg_gen_setcond_i32_aarch64(tcg_ctx,TCG_COND_GEU,tcg_ctx->cpu_CF,ret_02,ret_03);
  tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_NF,ret_02);
  ret_04 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_xor_i32(tcg_ctx,ret_04,ret_02,ret_03);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_03 + (long)tcg_ctx));
  tcg_gen_and_i32(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_VF,ret_04);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_04 + (long)tcg_ctx));
  tcg_gen_extu_i32_i64_aarch64(tcg_ctx,dest,tcg_ctx->cpu_NF);
  return;
}

Assistant:

static void gen_sub_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp;
    tcg_gen_sub_i32(tcg_ctx, tcg_ctx->cpu_NF, t0, t1);
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_CF, t0, t1);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_and_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}